

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void QTimer::singleShotImpl
               (nanoseconds ns,TimerType timerType,QObject *receiver,QSlotObjectBase *slotObj)

{
  long lVar1;
  QMetaMethodReturnArgument r;
  bool bVar2;
  nanoseconds nVar3;
  QThread *pQVar4;
  QThread *pQVar5;
  Duration in_RCX;
  long in_RDX;
  QSlotObjectBase *in_RDI;
  long in_FS_OFFSET;
  bool deleteReceiver;
  QMetaTypeInterface **in_stack_000000a0;
  R h;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff20;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff28;
  QObject *in_stack_ffffffffffffff38;
  QObject *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  QSlotObjectBase *in_stack_ffffffffffffff68;
  QObject *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  TimerType timerType_00;
  QSingleShotTimer *in_stack_ffffffffffffff80;
  undefined1 local_48 [8];
  char **in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  ConnectionType type;
  QObject *object;
  
  timerType_00 = (TimerType)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nVar3 = ns<(char)48>();
  type = (ConnectionType)((ulong)nVar3.__r >> 0x20);
  bVar2 = std::chrono::operator==(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  if (!bVar2) {
    operator_new(0x18);
    QSingleShotTimer::QSingleShotTimer
              (in_stack_ffffffffffffff80,in_RCX,timerType_00,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    goto LAB_0042b6b4;
  }
  bVar2 = false;
  if (in_RDX == 0) {
    pQVar4 = QThread::currentThread();
    pQVar5 = QCoreApplicationPrivate::mainThread();
    if (pQVar4 != pQVar5) goto LAB_0042b4f1;
    QThread::currentThread();
  }
  else {
LAB_0042b4f1:
    bVar2 = in_RDX == 0;
    if (bVar2) {
      in_stack_ffffffffffffff70 = (QObject *)operator_new(0x10);
      QObject::QObject(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  object = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  memset(local_48,0,0x18);
  r.name = (char *)in_stack_ffffffffffffff48;
  r.metaType = (QMetaTypeInterface *)in_stack_ffffffffffffff40;
  r.data = in_stack_ffffffffffffff50;
  QtPrivate::invokeMethodHelper<>(r);
  R::parameterCount((R *)0x42b5ee);
  std::array<const_void_*,_1UL>::data((array<const_void_*,_1UL> *)0x42b600);
  std::array<const_char_*,_1UL>::data((array<const_char_*,_1UL> *)0x42b616);
  std::array<const_QtPrivate::QMetaTypeInterface_*,_1UL>::data
            ((array<const_QtPrivate::QMetaTypeInterface_*,_1UL> *)0x42b62c);
  QMetaObject::invokeMethodImpl
            (object,in_RDI,type,(qsizetype)receiver,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_000000a0);
  if (bVar2) {
    QObject::deleteLater(in_stack_ffffffffffffff70);
  }
LAB_0042b6b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimer::singleShotImpl(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                            const QObject *receiver,
                            QtPrivate::QSlotObjectBase *slotObj)
{
    if (ns == 0ns) {
        bool deleteReceiver = false;
        // Optimize: set a receiver context when none is given, such that we can use
        // QMetaObject::invokeMethod which is more efficient than going through a timer.
        // We need a QObject living in the current thread. But the QThread itself lives
        // in a different thread - with the exception of the main QThread which lives in
        // itself. And QThread::currentThread() is among the few QObjects we know that will
        // most certainly be there. Note that one can actually call singleShot before the
        // QApplication is created!
        if (!receiver && QThread::currentThread() == QCoreApplicationPrivate::mainThread()) {
            // reuse main thread as context object
            receiver = QThread::currentThread();
        } else if (!receiver) {
            // Create a receiver context object on-demand. According to the benchmarks,
            // this is still more efficient than going through a timer.
            receiver = new QObject;
            deleteReceiver = true;
        }

        auto h = QtPrivate::invokeMethodHelper({});
        QMetaObject::invokeMethodImpl(const_cast<QObject *>(receiver), slotObj,
                Qt::QueuedConnection, h.parameterCount(), h.parameters.data(), h.typeNames.data(),
                h.metaTypes.data());

        if (deleteReceiver)
            const_cast<QObject *>(receiver)->deleteLater();
        return;
    }

    (void) new QSingleShotTimer(ns, timerType, receiver, slotObj);
}